

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O0

bool __thiscall
llm_tokenizer_bpe_session::append_bos
          (llm_tokenizer_bpe_session *this,vector<int,_std::allocator<int>_> *output)

{
  bool bVar1;
  llama_token lVar2;
  vector<int,_std::allocator<int>_> *in_RSI;
  value_type_conflict3 *in_stack_ffffffffffffffc8;
  bool local_1;
  
  bVar1 = llama_vocab::get_add_bos((llama_vocab *)0x540080);
  if (bVar1) {
    lVar2 = llama_vocab::token_bos((llama_vocab *)0x540093);
    if (lVar2 == -1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-vocab.cpp"
                 ,0x1ba,"GGML_ASSERT(%s) failed","vocab.token_bos() != LLAMA_TOKEN_NULL");
    }
    llama_vocab::token_bos((llama_vocab *)0x5400d0);
    llama_vocab::std::vector<int,_std::allocator<int>_>::push_back(in_RSI,in_stack_ffffffffffffffc8)
    ;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool append_bos(std::vector<llama_token> & output) const {
        if (vocab.get_add_bos()) {
            GGML_ASSERT(vocab.token_bos() != LLAMA_TOKEN_NULL);
            output.push_back(vocab.token_bos());
            return true;
        }
        return false;
    }